

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutils.c
# Opt level: O0

int luaopen_lutils(lua_State *L)

{
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0xb);
  luaL_setfuncs(L,lutils_functions,0);
  luv_buffer_init(L);
  return 1;
}

Assistant:

LUALIB_API int luaopen_lutils(lua_State *L) {

  luaL_newlib(L, lutils_functions);

  luv_buffer_init(L);

  return 1;
}